

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseTernaryOp(Parser *this)

{
  bool bVar1;
  uint uVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  Parser *in_RDI;
  Node *res;
  int in_stack_00000098;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  int in_stack_000000ac;
  CompilationContext *in_stack_000000b0;
  Node *ifFalse;
  Node *ifTrue;
  Token *qmarkToken;
  Node *expr;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  CompilationContext *__lhs;
  Node *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  Node *in_stack_fffffffffffffe48;
  Token *in_stack_fffffffffffffe50;
  allocator *paVar3;
  Parser *in_stack_fffffffffffffe58;
  allocator local_171;
  string local_170 [8];
  Parser *in_stack_fffffffffffffe98;
  string local_150 [32];
  string local_130 [36];
  TokenType token_type;
  Parser *in_stack_fffffffffffffef8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  Node *local_28;
  Token *local_20;
  Parser *local_8;
  
  token_type = (TokenType)((ulong)stack0xfffffffffffffef0 >> 0x20);
  local_8 = (Parser *)parseNullCoalesce(in_stack_fffffffffffffe98);
  if (local_8 == (Parser *)0x0) {
    local_8 = (Parser *)0x0;
  }
  else {
    uVar2 = accept(in_RDI,0x31,__addr,in_RCX);
    if ((uVar2 & 1) != 0) {
      local_20 = in_RDI->tok;
      local_28 = parseTernaryOp(local_8);
      if (local_28 == (Node *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,"expected expression but \'",&local_89);
        std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
        std::operator+(in_stack_fffffffffffffe28,
                       (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        std::operator+(in_stack_fffffffffffffe28,
                       (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        std::__cxx11::string::c_str();
        std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
        std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
        CompilationContext::error
                  (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_0000009c,
                   in_stack_00000098);
        std::__cxx11::string::~string(local_48);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        local_8 = (Parser *)0x0;
      }
      else {
        bVar1 = expect(in_stack_fffffffffffffef8,token_type);
        if (bVar1) {
          register0x00000000 = parseTernaryOp(local_8);
          if (register0x00000000 == (Node *)0x0) {
            __lhs = in_RDI->ctx;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,"expected expression but \'",&local_171);
            std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __lhs,(char *)CONCAT44(in_stack_fffffffffffffe24,
                                                  in_stack_fffffffffffffe20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __lhs,(char *)CONCAT44(in_stack_fffffffffffffe24,
                                                  in_stack_fffffffffffffe20));
            std::__cxx11::string::c_str();
            std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos)
            ;
            std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos)
            ;
            CompilationContext::error
                      (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_0000009c,
                       in_stack_00000098);
            std::__cxx11::string::~string(local_130);
            std::__cxx11::string::~string(local_150);
            std::__cxx11::string::~string(local_170);
            std::allocator<char>::~allocator((allocator<char> *)&local_171);
            local_8 = (Parser *)0x0;
          }
          else {
            local_8 = (Parser *)
                      createTernaryOpNode(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                          in_stack_fffffffffffffe48,
                                          (Node *)CONCAT44(in_stack_fffffffffffffe44,
                                                           in_stack_fffffffffffffe40),
                                          in_stack_fffffffffffffe38);
          }
        }
        else {
          paVar3 = (allocator *)&stack0xfffffffffffffeff;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_100,"expected \':\' but \'",paVar3);
          std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
          std::operator+(in_stack_fffffffffffffe28,
                         (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          std::operator+(in_stack_fffffffffffffe28,
                         (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          std::__cxx11::string::c_str();
          std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
          std::vector<Token,_std::allocator<Token>_>::operator[](in_RDI->tokens,(long)in_RDI->pos);
          CompilationContext::error
                    (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_0000009c,
                     in_stack_00000098);
          std::__cxx11::string::~string(local_c0);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
          local_8 = (Parser *)0x0;
        }
      }
    }
  }
  return (Node *)local_8;
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }